

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsum.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  int iVar6;
  string *input_stream;
  char *__s;
  int vector_length;
  int output_interval;
  int num_data;
  vector<double,_std::allocator<double>_> sum;
  StatisticsAccumulation accumulation;
  ostringstream error_message_5;
  vector<double,_std::allocator<double>_> data;
  Buffer buffer;
  ifstream ifs;
  int local_4b0;
  int local_4ac;
  string local_4a8;
  int local_484;
  ulong local_480;
  vector<double,_std::allocator<double>_> local_478;
  StatisticsAccumulation local_460;
  string local_448 [3];
  ios_base local_3d8 [264];
  vector<double,_std::allocator<double>_> local_2d0;
  Buffer local_2b8;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_4b0 = 1;
  local_4ac = -1;
  local_480 = 0;
  iVar6 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:t:ch",(option *)0x0,(int *)0x0);
    if (iVar4 < 0x6c) {
      if (iVar4 == -1) {
        iVar4 = 2;
      }
      else if (iVar4 == 99) {
        local_480 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
        iVar4 = 0;
      }
      else {
        if (iVar4 != 0x68) {
LAB_001038ed:
          anon_unknown.dwarf_2cfa::PrintUsage((ostream *)&std::cerr);
          goto LAB_00103a09;
        }
        anon_unknown.dwarf_2cfa::PrintUsage((ostream *)&std::cout);
        iVar6 = 0;
        iVar4 = 1;
      }
    }
    else {
      if (iVar4 == 0x74) {
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_448);
        bVar3 = sptk::ConvertStringToInteger(&local_238,&local_4ac);
        bVar1 = 0 < local_4ac;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar3 && bVar1) {
LAB_0010395e:
          iVar4 = 0;
          goto LAB_00103a14;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -t option must be a positive integer"
                   ,0x39);
        local_448[0]._M_dataplus._M_p = (pointer)&local_448[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"vsum","");
        sptk::PrintErrorMessage(local_448,(ostringstream *)&local_238);
      }
      else if (iVar4 == 0x6d) {
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_448);
        bVar1 = sptk::ConvertStringToInteger(&local_238,&local_4b0);
        bVar3 = -1 < local_4b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar1 && bVar3) {
          local_4b0 = local_4b0 + 1;
          goto LAB_0010395e;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_448[0]._M_dataplus._M_p = (pointer)&local_448[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"vsum","");
        sptk::PrintErrorMessage(local_448,(ostringstream *)&local_238);
      }
      else {
        if (iVar4 != 0x6c) goto LAB_001038ed;
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_448);
        bVar3 = sptk::ConvertStringToInteger(&local_238,&local_4b0);
        bVar1 = 0 < local_4b0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar3 && bVar1) goto LAB_0010395e;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_448[0]._M_dataplus._M_p = (pointer)&local_448[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"vsum","");
        sptk::PrintErrorMessage(local_448,(ostringstream *)&local_238);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448[0]._M_dataplus._M_p != &local_448[0].field_2) {
        operator_delete(local_448[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
LAB_00103a09:
      iVar4 = 1;
      iVar6 = 1;
    }
LAB_00103a14:
  } while (iVar4 == 0);
  if (iVar4 != 2) {
    return iVar6;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_448[0]._M_dataplus._M_p = (pointer)&local_448[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"vsum","");
    sptk::PrintErrorMessage(local_448,(ostringstream *)&local_238);
LAB_00103bfd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448[0]._M_dataplus._M_p != &local_448[0].field_2) {
      operator_delete(local_448[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    return 1;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Cannot set translation mode",0x1b);
    local_448[0]._M_dataplus._M_p = (pointer)&local_448[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"vsum","");
    sptk::PrintErrorMessage(local_448,(ostringstream *)&local_238);
    goto LAB_00103bfd;
  }
  input_stream = &local_238;
  std::ifstream::ifstream(input_stream);
  if ((__s != (char *)0x0) &&
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_448,"Cannot open file ",0x11);
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,__s,sVar5);
    local_2b8._vptr_Buffer = (_func_int **)&local_2b8.first_order_statistics_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"vsum","");
    sptk::PrintErrorMessage((string *)&local_2b8,(ostringstream *)local_448);
    if ((vector<double,_std::allocator<double>_> *)local_2b8._vptr_Buffer !=
        &local_2b8.first_order_statistics_) {
      operator_delete(local_2b8._vptr_Buffer);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
    std::ios_base::~ios_base(local_3d8);
    iVar6 = 1;
    goto LAB_00104008;
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    input_stream = (string *)&std::cin;
  }
  sptk::StatisticsAccumulation::StatisticsAccumulation(&local_460,local_4b0 + -1,1,false,false);
  sptk::StatisticsAccumulation::Buffer::Buffer(&local_2b8);
  if (local_460.is_valid_ == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_448,"Failed to initialize StatisticsAccumulation",0x2b);
    local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
    sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
    std::ios_base::~ios_base(local_3d8);
    iVar6 = 1;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2d0,(long)local_4b0,(allocator_type *)local_448);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_478,(long)local_4b0,(allocator_type *)local_448);
    iVar4 = 1;
    while (bVar1 = sptk::ReadStream<double>
                             (false,0,0,local_4b0,&local_2d0,(istream *)input_stream,(int *)0x0),
          bVar1) {
      bVar3 = sptk::StatisticsAccumulation::Run(&local_460,&local_2d0,&local_2b8);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_448,"Failed to accumulate statistics",0x1f);
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
        sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_448);
LAB_00103e4d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
        std::ios_base::~ios_base(local_3d8);
        iVar6 = 1;
        break;
      }
      if ((local_4ac != -1) && (iVar4 % local_4ac == 0)) {
        bVar3 = sptk::StatisticsAccumulation::GetSum(&local_460,&local_2b8,&local_478);
        if (bVar3) {
          bVar3 = sptk::WriteStream<double>(0,local_4b0,&local_478,(ostream *)&std::cout,(int *)0x0)
          ;
          if (bVar3) {
            if ((local_480 & 1) == 0) {
              sptk::StatisticsAccumulation::Clear(&local_460,&local_2b8);
            }
            goto LAB_00103d6d;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_448,"Failed to write statistics",0x1a);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
          sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_448);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_448,"Failed to accumulate statistics",0x1f);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
          sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_448);
        }
        goto LAB_00103e4d;
      }
LAB_00103d6d:
      iVar4 = iVar4 + 1;
    }
    if (!bVar1) {
      bVar1 = sptk::StatisticsAccumulation::GetNumData(&local_460,&local_2b8,&local_484);
      if (bVar1) {
        iVar6 = 0;
        if ((local_4ac != -1) || (iVar6 = 0, local_484 < 1)) goto LAB_00103fda;
        bVar1 = sptk::StatisticsAccumulation::GetSum(&local_460,&local_2b8,&local_478);
        if (bVar1) {
          iVar6 = 0;
          bVar1 = sptk::WriteStream<double>(0,local_4b0,&local_478,(ostream *)&std::cout,(int *)0x0)
          ;
          if (bVar1) goto LAB_00103fda;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_448,"Failed to write summation",0x19);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
          sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_448);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_448,"Failed to compute summation",0x1b);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
          sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_448);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_448,"Failed to accumulate statistics",0x1f);
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"vsum","");
        sptk::PrintErrorMessage(&local_4a8,(ostringstream *)local_448);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
        operator_delete(local_4a8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
      std::ios_base::~ios_base(local_3d8);
      iVar6 = 1;
    }
LAB_00103fda:
    if (local_478.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_478.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  sptk::StatisticsAccumulation::Buffer::~Buffer(&local_2b8);
LAB_00104008:
  std::ifstream::~ifstream(&local_238);
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  int output_interval(kMagicNumberForEndOfFile);
  bool cumulative_mode_flag(kDefaultCumulativeModeFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:t:ch", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("vsum", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        cumulative_mode_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::StatisticsAccumulation accumulation(vector_length - 1, 1);
  sptk::StatisticsAccumulation::Buffer buffer;
  if (!accumulation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize StatisticsAccumulation";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  std::vector<double> data(vector_length);
  std::vector<double> sum(vector_length);
  for (int vector_index(1);
       sptk::ReadStream(false, 0, 0, vector_length, &data, &input_stream, NULL);
       ++vector_index) {
    if (!accumulation.Run(data, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to accumulate statistics";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }

    if (kMagicNumberForEndOfFile != output_interval &&
        0 == vector_index % output_interval) {
      if (!accumulation.GetSum(buffer, &sum)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate statistics";
        sptk::PrintErrorMessage("vsum", error_message);
        return 1;
      }
      if (!sptk::WriteStream(0, vector_length, sum, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write statistics";
        sptk::PrintErrorMessage("vsum", error_message);
        return 1;
      }
      if (!cumulative_mode_flag) {
        accumulation.Clear(&buffer);
      }
    }
  }

  int num_data;
  if (!accumulation.GetNumData(buffer, &num_data)) {
    std::ostringstream error_message;
    error_message << "Failed to accumulate statistics";
    sptk::PrintErrorMessage("vsum", error_message);
    return 1;
  }

  if (kMagicNumberForEndOfFile == output_interval && 0 < num_data) {
    if (!accumulation.GetSum(buffer, &sum)) {
      std::ostringstream error_message;
      error_message << "Failed to compute summation";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
    if (!sptk::WriteStream(0, vector_length, sum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write summation";
      sptk::PrintErrorMessage("vsum", error_message);
      return 1;
    }
  }

  return 0;
}